

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O3

xmlDocPtr xmlRelaxNGCleanupDoc(xmlRelaxNGParserCtxtPtr ctxt,xmlDocPtr doc)

{
  xmlNodePtr root;
  
  root = xmlDocGetRootElement(doc);
  if (root == (xmlNodePtr)0x0) {
    xmlRngPErr(ctxt,(xmlNodePtr)doc,0x3fe,"xmlRelaxNGParse: %s is empty\n",ctxt->URL,(xmlChar *)0x0)
    ;
    doc = (xmlDocPtr)0x0;
  }
  else {
    xmlRelaxNGCleanupTree(ctxt,root);
  }
  return doc;
}

Assistant:

static xmlDocPtr
xmlRelaxNGCleanupDoc(xmlRelaxNGParserCtxtPtr ctxt, xmlDocPtr doc)
{
    xmlNodePtr root;

    /*
     * Extract the root
     */
    root = xmlDocGetRootElement(doc);
    if (root == NULL) {
        xmlRngPErr(ctxt, (xmlNodePtr) doc, XML_RNGP_EMPTY, "xmlRelaxNGParse: %s is empty\n",
                   ctxt->URL, NULL);
        return (NULL);
    }
    xmlRelaxNGCleanupTree(ctxt, root);
    return (doc);
}